

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handleOpt
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  ulong uVar1;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  Token local_130;
  Token local_108;
  string local_e0 [32];
  Token local_c0;
  ulong local_98;
  size_t j;
  string optName;
  allocator local_59;
  string local_58 [32];
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *local_38;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  string *arg_local;
  size_t sStack_20;
  char c_local;
  size_t i_local;
  Parser *this_local;
  
  local_38 = tokens;
  tokens_local = (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                  *)arg;
  arg_local._7_1_ = c;
  sStack_20 = i;
  i_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,":=",5,&local_59);
  lVar3 = std::__cxx11::string::find((char)local_58,(ulong)(uint)(int)arg_local._7_1_);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (lVar3 == -1) {
    this_local._4_4_ = this->mode;
  }
  else {
    std::__cxx11::string::substr((ulong)&j,(ulong)tokens_local);
    if (this->mode == ShortOpt) {
      for (local_98 = 0; uVar1 = local_98, uVar4 = std::__cxx11::string::size(), pvVar2 = local_38,
          uVar1 < uVar4; local_98 = local_98 + 1) {
        std::__cxx11::string::substr((ulong)local_e0,(ulong)&j);
        Token::Token(&local_c0,ShortOpt,local_e0);
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        push_back(pvVar2,&local_c0);
        Token::~Token(&local_c0);
        std::__cxx11::string::~string((string *)local_e0);
      }
    }
    else if ((this->mode == SlashOpt) &&
            (lVar3 = std::__cxx11::string::size(), pvVar2 = local_38, lVar3 == 1)) {
      Token::Token(&local_108,ShortOpt,(string *)&j);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(pvVar2,&local_108);
      Token::~Token(&local_108);
    }
    else {
      pvVar2 = local_38;
      Token::Token(&local_130,LongOpt,(string *)&j);
      std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
      push_back(pvVar2,&local_130);
      Token::~Token(&local_130);
    }
    this_local._4_4_ = None;
    std::__cxx11::string::~string((string *)&j);
  }
  return this_local._4_4_;
}

Assistant:

Mode handleOpt( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            if( std::string( ":=\0", 5 ).find( c ) == std::string::npos )
                return mode;

            std::string optName = arg.substr( from, i-from );
            if( mode == ShortOpt )
                for( std::size_t j = 0; j < optName.size(); ++j )
                    tokens.push_back( Token( Token::ShortOpt, optName.substr( j, 1 ) ) );
            else if( mode == SlashOpt && optName.size() == 1 )
                tokens.push_back( Token( Token::ShortOpt, optName ) );
            else
                tokens.push_back( Token( Token::LongOpt, optName ) );
            return None;
        }